

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

void * stbiw__sbgrowf(void **arr,int increment,int itemsize)

{
  void *pvVar1;
  int *piVar2;
  int iVar3;
  void *__ptr;
  
  pvVar1 = *arr;
  if (pvVar1 == (void *)0x0) {
    iVar3 = 2;
  }
  else {
    iVar3 = *(int *)((long)pvVar1 + -8) * 2 + 1;
  }
  __ptr = (void *)((long)pvVar1 + -8);
  if (pvVar1 == (void *)0x0) {
    __ptr = (void *)0x0;
  }
  piVar2 = (int *)realloc(__ptr,(long)(increment * iVar3) + 8);
  if (piVar2 != (int *)0x0) {
    if (*arr == (void *)0x0) {
      piVar2[1] = 0;
    }
    *arr = piVar2 + 2;
    *piVar2 = iVar3;
    return piVar2;
  }
  __assert_fail("p",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sps1112[P]pathfinder-2d/includes/stb_image_write.h"
                ,0x331,"void *stbiw__sbgrowf(void **, int, int)");
}

Assistant:

static void *stbiw__sbgrowf(void **arr, int increment, int itemsize)
{
   int m = *arr ? 2*stbiw__sbm(*arr)+increment : increment+1;
   void *p = STBIW_REALLOC_SIZED(*arr ? stbiw__sbraw(*arr) : 0, *arr ? (stbiw__sbm(*arr)*itemsize + sizeof(int)*2) : 0, itemsize * m + sizeof(int)*2);
   STBIW_ASSERT(p);
   if (p) {
      if (!*arr) ((int *) p)[1] = 0;
      *arr = (void *) ((int *) p + 2);
      stbiw__sbm(*arr) = m;
   }
   return *arr;
}